

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_lessthan(lua_State *L,int idx1,int idx2)

{
  TValue *pTVar1;
  TValue *o2_00;
  TValue *base;
  cTValue *o2;
  cTValue *o1;
  int idx2_local;
  int idx1_local;
  lua_State *L_local;
  
  pTVar1 = index2adr(L,idx1);
  o2_00 = index2adr(L,idx2);
  if ((pTVar1 == (TValue *)((L->glref).ptr64 + 0xf8)) ||
     (o2_00 == (TValue *)((L->glref).ptr64 + 0xf8))) {
    L_local._4_4_ = 0;
  }
  else if (((uint)((int)(pTVar1->field_4).it >> 0xf) < 0xfffffff3) &&
          ((uint)((int)(o2_00->field_4).it >> 0xf) < 0xfffffff3)) {
    L_local._4_4_ = (uint)(pTVar1->n < o2_00->n);
  }
  else {
    pTVar1 = lj_meta_comp(L,pTVar1,o2_00,0);
    if (pTVar1 < (TValue *)0x2) {
      L_local._4_4_ = (uint)pTVar1;
    }
    else {
      L->top = pTVar1 + 2;
      lj_vm_call(L,pTVar1,2);
      L->top = L->top + -3;
      L_local._4_4_ = (uint)((uint)((int)L->top[2].field_4.it >> 0xf) < 0xfffffffe);
    }
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_lessthan(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  if (o1 == niltv(L) || o2 == niltv(L)) {
    return 0;
  } else if (tvisint(o1) && tvisint(o2)) {
    return intV(o1) < intV(o2);
  } else if (tvisnumber(o1) && tvisnumber(o2)) {
    return numberVnum(o1) < numberVnum(o2);
  } else {
    TValue *base = lj_meta_comp(L, o1, o2, 0);
    if ((uintptr_t)base <= 1) {
      return (int)(uintptr_t)base;
    } else {
      L->top = base+2;
      lj_vm_call(L, base, 1+1);
      L->top -= 2+LJ_FR2;
      return tvistruecond(L->top+1+LJ_FR2);
    }
  }
}